

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_info.cpp
# Opt level: O3

bool nodecpp::stack_info_impl::stackPointerToInfo(void *ptr,StackFrameInfo *info)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_type __len1;
  pointer pcVar3;
  size_type __len2;
  int iVar4;
  int iVar5;
  size_t __len2_00;
  void *pvVar6;
  char *__data;
  _Alloc_hider _Var7;
  size_type __size;
  long lVar8;
  size_type __n;
  ulong __pos;
  undefined1 auVar9 [16];
  string r;
  Dl_info info_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  stdstring local_80;
  char *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>_11
  local_40;
  
  iVar4 = dladdr();
  if (iVar4 != 0) {
    info->offset = (uintptr_t)ptr;
    info->offset2 = (long)ptr - (long)local_50;
    __len1 = (info->modulePath)._M_string_length;
    __len2_00 = strlen(local_58);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
    ::_M_replace(&info->modulePath,0,__len1,local_58,__len2_00);
    pcVar3 = (info->modulePath)._M_dataplus._M_p;
    local_50 = &local_40;
    std::__cxx11::
    basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
    ::_M_construct<char*>
              ((basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
                *)&local_58,pcVar3,pcVar3 + (info->modulePath)._M_string_length);
    callAddr2Line(&local_a0,(stdstring *)&local_58,info->offset);
    if (local_50 != &local_40) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
      ::_M_destroy((basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
                    *)&local_58,local_40._M_allocated_capacity);
    }
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_a0,"??\n??:0\n");
    if ((iVar5 == 0) && (info->offset2 != 0)) {
      pcVar3 = (info->modulePath)._M_dataplus._M_p;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::
      basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
      ::_M_construct<char*>
                ((basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
                  *)&local_80,pcVar3,pcVar3 + (info->modulePath)._M_string_length);
      callAddr2Line(&local_c0,&local_80,info->offset2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_a0,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
        ::_M_destroy(&local_80,local_80.field_2._M_allocated_capacity);
      }
      uVar1 = info->offset;
      uVar2 = info->offset2;
      auVar9._8_4_ = (int)uVar1;
      auVar9._0_8_ = uVar2;
      auVar9._12_4_ = (int)((ulong)uVar1 >> 0x20);
      info->offset = uVar2;
      info->offset2 = auVar9._8_8_;
    }
    __len2 = local_a0._M_string_length;
    _Var7._M_p = local_a0._M_dataplus._M_p;
    if (local_a0._M_string_length != 0) {
      pvVar6 = memchr(local_a0._M_dataplus._M_p,10,local_a0._M_string_length);
      __n = (long)pvVar6 - (long)_Var7._M_p;
      if (__n == 0xffffffffffffffff || pvVar6 == (void *)0x0) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
        ::_M_replace(&info->functionName,0,(info->functionName)._M_string_length,_Var7._M_p,__len2);
        _Var7._M_p = local_a0._M_dataplus._M_p;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_c0,&local_a0,0,__n);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
        ::_M_replace(&info->functionName,0,(info->functionName)._M_string_length,
                     local_c0._M_dataplus._M_p,local_c0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
                ::compare(&info->functionName,"??");
        _Var7._M_p = local_a0._M_dataplus._M_p;
        if (iVar5 == 0) {
          (info->functionName)._M_string_length = 0;
          *(info->functionName)._M_dataplus._M_p = '\0';
        }
        __pos = __n + 1;
        if (__pos <= local_a0._M_string_length && local_a0._M_string_length - __pos != 0) {
          pvVar6 = memchr(local_a0._M_dataplus._M_p + __pos,0x3a,local_a0._M_string_length - __pos);
          lVar8 = (long)pvVar6 - (long)_Var7._M_p;
          if (lVar8 != -1 && pvVar6 != (void *)0x0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_c0,&local_a0,__pos,lVar8 - __pos);
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
            ::_M_replace(&info->srcPath,0,(info->srcPath)._M_string_length,local_c0._M_dataplus._M_p
                         ,local_c0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            iVar5 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
                    ::compare(&info->srcPath,"??");
            if (iVar5 == 0) {
              (info->srcPath)._M_string_length = 0;
              *(info->srcPath)._M_dataplus._M_p = '\0';
            }
            lVar8 = atol(local_a0._M_dataplus._M_p + lVar8 + 1);
            info->line = (int)lVar8;
            _Var7._M_p = local_a0._M_dataplus._M_p;
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p != &local_a0.field_2) {
      operator_delete(_Var7._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar4 != 0;
}

Assistant:

bool stackPointerToInfo( void* ptr, nodecpp::stack_info_impl::StackFrameInfo& info )
	{
	#if defined(NODECPP_WINDOWS)

		static constexpr size_t TRACE_MAX_FUNCTION_NAME_LENGTH = 1024;
		HANDLE process = GetCurrentProcess();
		uint8_t symbolBuff[ sizeof(SYMBOL_INFO) + (TRACE_MAX_FUNCTION_NAME_LENGTH - 1) * sizeof(TCHAR) ];
		SYMBOL_INFO *symbol = (SYMBOL_INFO *)symbolBuff;
		symbol->MaxNameLen = TRACE_MAX_FUNCTION_NAME_LENGTH;
		symbol->SizeOfStruct = sizeof(SYMBOL_INFO);
		DWORD displacement = 0;
		IMAGEHLP_LINE64 line;
		DWORD64 address = (DWORD64)(ptr);
		bool addrOK = false;
	#ifndef _DEBUG
		addrOK = SymFromAddr(process, address, NULL, symbol);
	#endif
		bool fileLineOK = SymGetLineFromAddr64(process, address, &displacement, &line);

		if ( fileLineOK )
		{
			info.srcPath = line.FileName;
			info.line = line.LineNumber;
		}
		if ( addrOK )
			info.functionName = symbol->Name;
		return true;

	#elif defined(NODECPP_LINUX) && defined(NODECPP_GCC)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			useAddr2Line( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_LINUX) && defined(NODECPP_CLANG)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			// mb: I see strange behaviour on clang on linux.
			// when we are the main executable, ptr returned by
			// backtrace is already an offset. But is an absolute
			// address when we are a dynamic load library
			info.offset = reinterpret_cast<uintptr_t>(ptr);
			info.offset2 = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			useAddr2Line( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_MAC)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			// mb: addr2line is not found on mac, use atos
			useAtos( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_ANDROID)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			// mb: clang on android behaves as gcc on linux,
			// and not as clang on linux
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;

			// mb: addr2line is not present on the device, is on the host where cross compile took place, i.e.
			// %ANDROID_HOME%\ndk\24.0.8215888\toolchains\llvm\prebuilt\windows-x86_64\bin\llvm-addr2line.exe
			// useAddr2Line( info );
			return true;
		}
		else
			return false;

	#else
	#error platform not (yet) supported, use NODECPP_NO_STACK_INFO_IN_EXCEPTIONS
	#endif // platform/compiler
	}